

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QLayoutItem * __thiscall
QMainWindowLayoutState::takeAt(QMainWindowLayoutState *this,int index,int *x)

{
  QLayoutItem *pQVar1;
  int in_ESI;
  int *in_RDI;
  QLayoutItem *ret_1;
  QLayoutItem *ret;
  QDockAreaLayout *in_stack_fffffffffffffff8;
  
  pQVar1 = QToolBarAreaLayout::takeAt((QToolBarAreaLayout *)x,(int *)ret,ret_1._4_4_);
  if ((pQVar1 == (QLayoutItem *)0x0) &&
     (pQVar1 = QDockAreaLayout::takeAt(in_stack_fffffffffffffff8,in_RDI,in_ESI),
     pQVar1 == (QLayoutItem *)0x0)) {
    pQVar1 = (QLayoutItem *)0x0;
  }
  return pQVar1;
}

Assistant:

QLayoutItem *QMainWindowLayoutState::takeAt(int index, int *x)
{
#if QT_CONFIG(toolbar)
    if (QLayoutItem *ret = toolBarAreaLayout.takeAt(x, index))
        return ret;
#endif

#if QT_CONFIG(dockwidget)
    if (QLayoutItem *ret = dockAreaLayout.takeAt(x, index))
        return ret;
#else
    if (centralWidgetItem && (*x)++ == index) {
        QLayoutItem *ret = centralWidgetItem;
        centralWidgetItem = nullptr;
        return ret;
    }
#endif

    return nullptr;
}